

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log.cpp
# Opt level: O0

float pbrt::anon_unknown_3::ElapsedSeconds(void)

{
  int iVar1;
  float fVar2;
  int64_t elapseduS;
  time_point now;
  lock_guard<std::mutex> lock;
  undefined4 in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffac;
  lock_guard<std::mutex> *in_stack_ffffffffffffffb0;
  time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  *in_stack_ffffffffffffffb8;
  duration<long,_std::ratio<1L,_1000000L>_> local_20;
  rep local_18;
  undefined8 local_10;
  
  std::lock_guard<std::mutex>::lock_guard
            (in_stack_ffffffffffffffb0,
             (mutex_type *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
  if ((anonymous_namespace)::ElapsedSeconds()::start == '\0') {
    iVar1 = __cxa_guard_acquire(&(anonymous_namespace)::ElapsedSeconds()::start);
    if (iVar1 != 0) {
      ElapsedSeconds::start.__d.__r = (duration)std::chrono::_V2::steady_clock::now();
      __cxa_guard_release(&(anonymous_namespace)::ElapsedSeconds()::start);
    }
  }
  local_10 = std::chrono::_V2::steady_clock::now();
  std::chrono::operator-
            (in_stack_ffffffffffffffb8,
             (time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
              *)in_stack_ffffffffffffffb0);
  local_20.__r = (rep)std::chrono::
                      duration_cast<std::chrono::duration<long,std::ratio<1l,1000000l>>,long,std::ratio<1l,1000000000l>>
                                ((duration<long,_std::ratio<1L,_1000000000L>_> *)
                                 CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
  local_18 = std::chrono::duration<long,_std::ratio<1L,_1000000L>_>::count(&local_20);
  fVar2 = (float)((double)local_18 / 1000000.0);
  std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)0x712ef0);
  return fVar2;
}

Assistant:

float ElapsedSeconds() {
    static std::mutex mutex;
    std::lock_guard<std::mutex> lock(mutex);

    using clock = std::chrono::steady_clock;
    static clock::time_point start = clock::now();

    clock::time_point now = clock::now();
    int64_t elapseduS =
        std::chrono::duration_cast<std::chrono::microseconds>(now - start).count();
    return elapseduS / 1000000.;
}